

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double apser(double *a,double *b,double *x,double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = *x;
  apser::bx = *b * dVar2;
  apser::t = dVar2 - apser::bx;
  if (*b * *eps <= 0.02) {
    dVar2 = log(dVar2);
    dVar1 = psi(b);
    dVar1 = dVar1 + dVar2;
  }
  else {
    dVar1 = log(apser::bx);
  }
  dVar2 = dVar1 + 0.577215664901533 + apser::t;
  dVar1 = 0.0;
  dVar3 = 1.0;
  do {
    dVar3 = dVar3 + 1.0;
    apser::t = apser::t * (*x - apser::bx / dVar3);
    dVar1 = dVar1 + apser::t / dVar3;
  } while (ABS(dVar2) * *eps * 5.0 < ABS(apser::t / dVar3));
  return -*a * (dVar2 + dVar1);
}

Assistant:

double apser(double *a,double *b,double *x,double *eps)
/*
-----------------------------------------------------------------------
     APSER YIELDS THE INCOMPLETE BETA RATIO I(SUB(1-X))(B,A) FOR
     A .LE. MIN(EPS,EPS*B), B*X .LE. 1, AND X .LE. 0.5. USED WHEN
     A IS VERY SMALL. USE ONLY IF ABOVE INEQUALITIES ARE SATISFIED.
-----------------------------------------------------------------------
*/
{
static double g = .577215664901533e0;
static double apser,aj,bx,c,j,s,t,tol;
/*
     ..
     .. Executable Statements ..
*/
    bx = *b**x;
    t = *x-bx;
    if(*b**eps > 2.e-2) goto S10;
    c = log(*x)+psi(b)+g+t;
    goto S20;
S10:
    c = log(bx)+g+t;
S20:
    tol = 5.0e0**eps*fabs(c);
    j = 1.0e0;
    s = 0.0e0;
S30:
    j += 1.0e0;
    t *= (*x-bx/j);
    aj = t/j;
    s += aj;
    if(fabs(aj) > tol) goto S30;
    apser = -(*a*(c+s));
    return apser;
}